

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  cmGeneratorTarget *this_00;
  cmake *this_01;
  bool bVar1;
  TargetType TVar2;
  Cxx20SupportLevel CVar3;
  ulong uVar4;
  string *__rhs;
  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *this_02
  ;
  reference pvVar5;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this_03;
  reference ppcVar6;
  ostream *poVar7;
  PolicyID id;
  string *local_870;
  undefined1 local_818 [16];
  string local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_7e8;
  string local_7d8;
  string local_7b8;
  undefined1 local_798 [8];
  ostringstream w;
  string local_618;
  ArtifactType local_5f4;
  cmGeneratorTarget *pcStack_5f0;
  ArtifactType artifact;
  cmGeneratorTarget *tgt;
  iterator __end2;
  iterator __begin2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *wrongItems;
  string local_5c0;
  cmValue local_5a0;
  cmValue lss;
  cmListFileBacktrace local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_560;
  ItemIsPath local_52c;
  cmListFileBacktrace local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4f8;
  ItemIsPath local_4c4;
  cmListFileBacktrace local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_490;
  ItemIsPath local_45c;
  cmListFileBacktrace local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_428;
  ItemIsPath local_3f4;
  cmListFileBacktrace local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3c0;
  FeatureDescriptor *local_390;
  FeatureDescriptor *groupFeature;
  LinkEntry *linkEntry;
  const_iterator __end1;
  const_iterator __begin1;
  EntryVector *__range1;
  FeatureDescriptor *currentFeature;
  EntryVector *linkEntries;
  cmComputeLinkDepends cld;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmComputeLinkInformation *local_18;
  cmComputeLinkInformation *this_local;
  
  local_18 = this;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (((((TVar2 == EXECUTABLE) ||
        (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == SHARED_LIBRARY)) ||
       (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == MODULE_LIBRARY)) ||
      (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == STATIC_LIBRARY)) ||
     ((bVar1 = cmGeneratorTarget::CanCompileSources(this->Target), bVar1 &&
      ((CVar3 = cmGeneratorTarget::HaveCxxModuleSupport(this->Target,&this->Config),
       CVar3 == Supported || (bVar1 = cmGeneratorTarget::HaveFortranSources(this->Target), bVar1))))
     )) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cmComputeLinkDepends::cmComputeLinkDepends
                ((cmComputeLinkDepends *)&linkEntries,this->Target,&this->Config,&this->LinkLanguage
                );
      cmComputeLinkDepends::SetOldLinkDirMode
                ((cmComputeLinkDepends *)&linkEntries,(bool)(this->OldLinkDirMode & 1));
      this_02 = cmComputeLinkDepends::Compute((cmComputeLinkDepends *)&linkEntries);
      __range1 = (EntryVector *)0x0;
      __end1 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::begin(this_02);
      linkEntry = (LinkEntry *)
                  std::
                  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ::end(this_02);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                                         *)&linkEntry), bVar1) {
        groupFeature = (FeatureDescriptor *)
                       __gnu_cxx::
                       __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                       ::operator*(&__end1);
        if (*(int *)((long)&(groupFeature->Prefix).field_2 + 8) == 4) {
          local_390 = GetGroupFeature(this,&groupFeature->Suffix);
          if ((local_390->Supported & 1U) != 0) {
            bVar1 = std::operator==(&groupFeature->Name,"</LINK_GROUP>");
            if ((bVar1) && (__range1 != (EntryVector *)0x0)) {
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                std::__cxx11::string::string((string *)&local_3e0,(string *)(__range1 + 3));
                pvVar5 = std::
                         vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                         ::back(&this->Items);
                cmListFileBacktrace::cmListFileBacktrace(&local_3f0,&(pvVar5->Value).Backtrace);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT(&local_3c0,&local_3e0,&local_3f0);
                local_3f4 = No;
                std::
                vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                          ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                            *)this,&local_3c0,&local_3f4);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT(&local_3c0);
                cmListFileBacktrace::~cmListFileBacktrace(&local_3f0);
                std::__cxx11::string::~string((string *)&local_3e0);
              }
              __range1 = (EntryVector *)0x0;
            }
            bVar1 = std::operator==(&groupFeature->Name,"<LINK_GROUP>");
            if (bVar1) {
              local_870 = (string *)&local_390->Prefix;
            }
            else {
              local_870 = (string *)&local_390->Suffix;
            }
            std::__cxx11::string::string((string *)&local_448,local_870);
            cmListFileBacktrace::cmListFileBacktrace
                      (&local_458,(cmListFileBacktrace *)&groupFeature->Supported);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                      (&local_428,&local_448,&local_458);
            local_45c = No;
            std::
            vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
            emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                      ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                        *)this,&local_428,&local_45c);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT(&local_428);
            cmListFileBacktrace::~cmListFileBacktrace(&local_458);
            std::__cxx11::string::~string((string *)&local_448);
          }
        }
        else {
          if ((__range1 != (EntryVector *)0x0) &&
             (bVar1 = std::operator!=(&groupFeature->Suffix,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__range1), bVar1)) {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::__cxx11::string::string((string *)&local_4b0,(string *)(__range1 + 3));
              pvVar5 = std::
                       vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                       ::back(&this->Items);
              cmListFileBacktrace::cmListFileBacktrace(&local_4c0,&(pvVar5->Value).Backtrace);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT(&local_490,&local_4b0,&local_4c0);
              local_4c4 = No;
              std::
              vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                        ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                          *)this,&local_490,&local_4c4);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT(&local_490);
              cmListFileBacktrace::~cmListFileBacktrace(&local_4c0);
              std::__cxx11::string::~string((string *)&local_4b0);
            }
            __range1 = (EntryVector *)0x0;
          }
          bVar1 = std::operator!=(&groupFeature->Suffix,(anonymous_namespace)::DEFAULT_abi_cxx11_);
          if ((bVar1) &&
             ((__range1 == (EntryVector *)0x0 ||
              (bVar1 = std::operator!=(&groupFeature->Suffix,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__range1), bVar1)))) {
            bVar1 = AddLibraryFeature(this,&groupFeature->Suffix);
            if (!bVar1) goto LAB_0071bcbf;
            __range1 = (EntryVector *)FindLibraryFeature(this,&groupFeature->Suffix);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::__cxx11::string::string
                        ((string *)&local_518,(string *)&((FeatureDescriptor *)__range1)->Prefix);
              cmListFileBacktrace::cmListFileBacktrace
                        (&local_528,(cmListFileBacktrace *)&groupFeature->Supported);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT(&local_4f8,&local_518,&local_528);
              local_52c = No;
              std::
              vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              ::emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                        ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                          *)this,&local_4f8,&local_52c);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT(&local_4f8);
              cmListFileBacktrace::~cmListFileBacktrace(&local_528);
              std::__cxx11::string::~string((string *)&local_518);
            }
          }
          if (*(int *)((long)&(groupFeature->Prefix).field_2 + 8) == 2) {
            AddSharedDepItem(this,(LinkEntry *)groupFeature);
          }
          else {
            AddItem(this,(LinkEntry *)groupFeature);
          }
        }
LAB_0071bcbf:
        __gnu_cxx::
        __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
        ::operator++(&__end1);
      }
      if ((__range1 != (EntryVector *)0x0) &&
         (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        std::__cxx11::string::string((string *)&local_580,(string *)(__range1 + 3));
        pvVar5 = std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::back(&this->Items);
        cmListFileBacktrace::cmListFileBacktrace(&local_590,&(pvVar5->Value).Backtrace);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_560,&local_580,&local_590);
        lss.Value._4_4_ = 0;
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,&local_560,(ItemIsPath *)((long)&lss.Value + 4));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_560);
        cmListFileBacktrace::~cmListFileBacktrace(&local_590);
        std::__cxx11::string::~string((string *)&local_580);
      }
      this_00 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c0,"LINK_SEARCH_END_STATIC",
                 (allocator<char> *)((long)&wrongItems + 7));
      local_5a0 = cmGeneratorTarget::GetProperty(this_00,&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&wrongItems + 7));
      bVar1 = cmValue::IsOn(&local_5a0);
      if (bVar1) {
        SetCurrentLinkType(this,LinkStatic);
      }
      else {
        SetCurrentLinkType(this,this->StartLinkType);
      }
      if ((this->OldLinkDirMode & 1U) != 0) {
        this_03 = cmComputeLinkDepends::GetOldWrongConfigItems((cmComputeLinkDepends *)&linkEntries)
        ;
        __end2 = std::
                 set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(this_03);
        tgt = (cmGeneratorTarget *)
              std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::end(this_03);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&tgt), bVar1) {
          ppcVar6 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end2);
          pcStack_5f0 = *ppcVar6;
          bVar1 = cmGeneratorTarget::HasImportLibrary(pcStack_5f0,&this->Config);
          local_5f4 = (ArtifactType)bVar1;
          cmGeneratorTarget::GetFullPath(&local_618,pcStack_5f0,&this->Config,local_5f4,true);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->OldLinkDirItems,&local_618);
          std::__cxx11::string::~string((string *)&local_618);
          std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end2);
        }
      }
      bVar1 = FinishLinkerSearchDirectories(this);
      if (bVar1) {
        AddImplicitLinkInfo(this);
        bVar1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->CMP0060WarnItems);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_7b8,(cmPolicies *)0x3c,id);
          poVar7 = std::operator<<((ostream *)local_798,(string *)&local_7b8);
          poVar7 = std::operator<<(poVar7,
                                   "\nSome library files are in directories implicitly searched by the linker when invoked for "
                                  );
          poVar7 = std::operator<<(poVar7,(string *)&this->LinkLanguage);
          poVar7 = std::operator<<(poVar7,":\n ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_7e8,"\n ");
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_7d8,&this->CMP0060WarnItems,(string_view)local_7e8);
          poVar7 = std::operator<<(poVar7,(string *)&local_7d8);
          std::operator<<(poVar7,
                          "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
                         );
          std::__cxx11::string::~string((string *)&local_7d8);
          std::__cxx11::string::~string((string *)&local_7b8);
          this_01 = this->CMakeInstance;
          std::__cxx11::ostringstream::str();
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_818);
          cmake::IssueMessage(this_01,AUTHOR_WARNING,(string *)(local_818 + 0x10),
                              (cmListFileBacktrace *)local_818);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_818);
          std::__cxx11::string::~string((string *)(local_818 + 0x10));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
        }
        AddExternalObjectTargets(this);
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
      cmComputeLinkDepends::~cmComputeLinkDepends((cmComputeLinkDepends *)&linkEntries);
    }
    else {
      __rhs = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      std::operator+(&local_38,"CMake can not determine linker language for target: ",__rhs);
      cmSystemTools::Error(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link or have link-like information consumers may
  // need (namely modules).
  if (!(this->Target->GetType() == cmStateEnums::EXECUTABLE ||
        this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        (this->Target->CanCompileSources() &&
         (this->Target->HaveCxxModuleSupport(this->Config) ==
            cmGeneratorTarget::Cxx20SupportLevel::Supported ||
          this->Target->HaveFortranSources())))) {
    return false;
  }

  // We require a link language for the target.
  if (this->LinkLanguage.empty()) {
    cmSystemTools::Error(
      "CMake can not determine linker language for target: " +
      this->Target->GetName());
    return false;
  }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config, this->LinkLanguage);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();
  FeatureDescriptor const* currentFeature = nullptr;

  // Add the link line items.
  for (cmComputeLinkDepends::LinkEntry const& linkEntry : linkEntries) {
    if (linkEntry.Kind == cmComputeLinkDepends::LinkEntry::Group) {
      const auto& groupFeature = this->GetGroupFeature(linkEntry.Feature);
      if (groupFeature.Supported) {
        if (linkEntry.Item.Value == "</LINK_GROUP>" &&
            currentFeature != nullptr) {
          // emit feature suffix, if any
          if (!currentFeature->Suffix.empty()) {
            this->Items.emplace_back(
              BT<std::string>{ currentFeature->Suffix,
                               this->Items.back().Value.Backtrace },
              ItemIsPath::No);
          }
          currentFeature = nullptr;
        }
        this->Items.emplace_back(
          BT<std::string>{ linkEntry.Item.Value == "<LINK_GROUP>"
                             ? groupFeature.Prefix
                             : groupFeature.Suffix,
                           linkEntry.Item.Backtrace },
          ItemIsPath::No);
      }
      continue;
    }

    if (currentFeature != nullptr &&
        linkEntry.Feature != currentFeature->Name) {
      // emit feature suffix, if any
      if (!currentFeature->Suffix.empty()) {
        this->Items.emplace_back(
          BT<std::string>{ currentFeature->Suffix,
                           this->Items.back().Value.Backtrace },
          ItemIsPath::No);
      }
      currentFeature = nullptr;
    }

    if (linkEntry.Feature != DEFAULT &&
        (currentFeature == nullptr ||
         linkEntry.Feature != currentFeature->Name)) {
      if (!this->AddLibraryFeature(linkEntry.Feature)) {
        continue;
      }
      currentFeature = this->FindLibraryFeature(linkEntry.Feature);
      // emit feature prefix, if any
      if (!currentFeature->Prefix.empty()) {
        this->Items.emplace_back(
          BT<std::string>{ currentFeature->Prefix, linkEntry.Item.Backtrace },
          ItemIsPath::No);
      }
    }

    if (linkEntry.Kind == cmComputeLinkDepends::LinkEntry::SharedDep) {
      this->AddSharedDepItem(linkEntry);
    } else {
      this->AddItem(linkEntry);
    }
  }

  if (currentFeature != nullptr) {
    // emit feature suffix, if any
    if (!currentFeature->Suffix.empty()) {
      this->Items.emplace_back(
        BT<std::string>{ currentFeature->Suffix,
                         this->Items.back().Value.Backtrace },
        ItemIsPath::No);
    }
  }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  cmValue lss = this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if (lss.IsOn()) {
    this->SetCurrentLinkType(LinkStatic);
  } else {
    this->SetCurrentLinkType(this->StartLinkType);
  }

  // Finish listing compatibility paths.
  if (this->OldLinkDirMode) {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
      cld.GetOldWrongConfigItems();
    for (cmGeneratorTarget const* tgt : wrongItems) {
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(this->Config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      this->OldLinkDirItems.push_back(
        tgt->GetFullPath(this->Config, artifact, true));
    }
  }

  // Finish setting up linker search directories.
  if (!this->FinishLinkerSearchDirectories()) {
    return false;
  }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    /* clang-format on */
    this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
  }

  // Record targets referenced by $<TARGET_OBJECTS:...> sources.
  this->AddExternalObjectTargets();

  return true;
}